

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::x86::X86RAPass::emitSwap
          (X86RAPass *this,uint32_t aWorkId,uint32_t aPhysId,uint32_t bWorkId,uint32_t bPhysId)

{
  VirtReg *pVVar1;
  VirtReg *pVVar2;
  Error EVar3;
  RAWorkReg *pRVar4;
  RAWorkReg *pRVar5;
  byte bVar6;
  BaseBuilder *this_00;
  char *pcVar7;
  undefined4 uVar8;
  undefined8 local_48;
  uint32_t local_40 [2];
  undefined8 local_38;
  uint32_t local_30 [2];
  
  pRVar4 = BaseRAPass::workRegById(&this->super_BaseRAPass,aWorkId);
  pRVar5 = BaseRAPass::workRegById(&this->super_BaseRAPass,bWorkId);
  pVVar1 = pRVar4->_virtReg;
  pVVar2 = pRVar5->_virtReg;
  bVar6 = pVVar2->_typeId;
  if (pVVar2->_typeId < pVVar1->_typeId) {
    bVar6 = pVVar1->_typeId;
  }
  uVar8 = 0x4000029;
  if (0x27 < bVar6) {
    uVar8 = 0x8000031;
  }
  if (((this->super_BaseRAPass)._loggerFlags & 0x40) == 0) {
    this_00 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
  }
  else {
    if (*(uint *)&(pVVar1->_name).field_0 < 0xc) {
      local_48 = (char *)((long)&(pVVar1->_name).field_0 + 4);
    }
    else {
      local_48 = *(char **)((long)&(pVVar1->_name).field_0 + 8);
    }
    if (*(uint *)&(pVVar2->_name).field_0 < 0xc) {
      local_38 = (char *)((long)&(pVVar2->_name).field_0 + 4);
    }
    else {
      local_38 = *(char **)((long)&(pVVar2->_name).field_0 + 8);
    }
    String::assignFormat<char_const*,char_const*>
              (&(this->super_BaseRAPass)._tmpString.super_String,"<SWAP> %s, %s",(char **)&local_48,
               (char **)&local_38);
    this_00 = (this->super_BaseRAPass).super_FuncPass.super_Pass._cb;
    if ((this->super_BaseRAPass)._tmpString.super_String.field_0._type < 0x1f) {
      pcVar7 = (char *)((long)&(this->super_BaseRAPass)._tmpString.super_String.field_0 + 1);
    }
    else {
      pcVar7 = (this->super_BaseRAPass)._tmpString.super_String.field_0._large.data;
    }
    (this_00->super_BaseEmitter)._inlineComment = pcVar7;
  }
  local_48 = (char *)CONCAT44(aPhysId,uVar8);
  local_40[0] = 0;
  local_40[1] = 0;
  local_38 = (char *)CONCAT44(bPhysId,uVar8);
  local_30[0] = 0;
  local_30[1] = 0;
  EVar3 = BaseEmitter::_emitI(&this_00->super_BaseEmitter,0x5fe,(Operand_ *)&local_48,
                              (Operand_ *)&local_38);
  return EVar3;
}

Assistant:

Error X86RAPass::emitSwap(uint32_t aWorkId, uint32_t aPhysId, uint32_t bWorkId, uint32_t bPhysId) noexcept {
  RAWorkReg* waReg = workRegById(aWorkId);
  RAWorkReg* wbReg = workRegById(bWorkId);

  bool is64Bit = Support::max(waReg->typeId(), wbReg->typeId()) >= Type::kIdI64;
  uint32_t sign = is64Bit ? uint32_t(RegTraits<Reg::kTypeGpq>::kSignature)
                          : uint32_t(RegTraits<Reg::kTypeGpd>::kSignature);

#ifndef ASMJIT_NO_LOGGING
  if (_loggerFlags & FormatOptions::kFlagAnnotations) {
    _tmpString.assignFormat("<SWAP> %s, %s", waReg->name(), wbReg->name());
    cc()->setInlineComment(_tmpString.data());
  }
#endif

  return cc()->emit(Inst::kIdXchg,
                    Reg::fromSignatureAndId(sign, aPhysId),
                    Reg::fromSignatureAndId(sign, bPhysId));
}